

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uInput.cpp
# Opt level: O3

void __thiscall uInputPlus::uInput::__init(uInput *this,uInputSetup *setup)

{
  size_t *psVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  pointer puVar5;
  _Base_ptr *pp_Var6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  system_error *this_00;
  int *piVar11;
  error_category *peVar12;
  _Base_ptr p_Var13;
  pointer puVar14;
  
  iVar7 = open("/dev/uinput",0x801);
  this->fd_ = iVar7;
  if (iVar7 < 0) {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar11 = __errno_location();
    iVar7 = *piVar11;
    peVar12 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_00,iVar7,peVar12,"failed to open uinput device");
  }
  else {
    p_Var3 = &(setup->Events)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var8 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != p_Var3;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      iVar7 = ioctl(this->fd_,0x40045564,(ulong)p_Var8[1]._M_color);
      if (iVar7 != 0) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar11 = __errno_location();
        iVar7 = *piVar11;
        peVar12 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,iVar7,peVar12,"UI_SET_EVBIT ioctl failed");
        goto LAB_00104264;
      }
    }
    p_Var10 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var3->_M_header;
    p_Var13 = p_Var10;
    if (p_Var10 != (_Base_ptr)0x0) {
      do {
        psVar1 = (size_t *)(p_Var13 + 1);
        if (0 < (int)*psVar1) {
          p_Var9 = p_Var13;
        }
        pp_Var6 = &p_Var13->_M_left;
        p_Var13 = pp_Var6[(int)*psVar1 < 1];
      } while (pp_Var6[(int)*psVar1 < 1] != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var9 != p_Var3) &&
         ((int)((_Rb_tree_header *)p_Var9)->_M_node_count < 2)) {
        p_Var9 = (setup->Keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var4 = &(setup->Keys)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var9 != p_Var4) {
          do {
            iVar7 = ioctl(this->fd_,0x40045565,(ulong)p_Var9[1]._M_color);
            if (iVar7 != 0) {
              this_00 = (system_error *)__cxa_allocate_exception(0x20);
              piVar11 = __errno_location();
              iVar7 = *piVar11;
              peVar12 = (error_category *)std::_V2::system_category();
              std::system_error::system_error(this_00,iVar7,peVar12,"UI_SET_EVBIT ioctl failed");
              goto LAB_00104264;
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while ((_Rb_tree_header *)p_Var9 != p_Var4);
          p_Var10 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        }
      }
      p_Var9 = &p_Var3->_M_header;
      p_Var13 = p_Var10;
      if (p_Var10 != (_Base_ptr)0x0) {
        do {
          p_Var2 = p_Var13 + 1;
          if (1 < (int)p_Var2->_M_color) {
            p_Var9 = p_Var13;
          }
          pp_Var6 = &p_Var13->_M_left;
          p_Var13 = pp_Var6[(int)p_Var2->_M_color < 2];
        } while (pp_Var6[(int)p_Var2->_M_color < 2] != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var9 != p_Var3) && ((int)p_Var9[1]._M_color < 3)) {
          p_Var9 = (setup->Rels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var4 = &(setup->Rels)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var9 != p_Var4) {
            do {
              iVar7 = ioctl(this->fd_,0x40045566,(ulong)p_Var9[1]._M_color);
              if (iVar7 != 0) {
                this_00 = (system_error *)__cxa_allocate_exception(0x20);
                piVar11 = __errno_location();
                iVar7 = *piVar11;
                peVar12 = (error_category *)std::_V2::system_category();
                std::system_error::system_error(this_00,iVar7,peVar12,"UI_SET_RELBIT ioctl failed");
                goto LAB_00104264;
              }
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
            } while ((_Rb_tree_header *)p_Var9 != p_Var4);
            p_Var10 = (setup->Events)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          }
        }
        p_Var9 = &p_Var3->_M_header;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            if (2 < (int)p_Var10[1]._M_color) {
              p_Var9 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < 3];
          } while (p_Var10 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var9 != p_Var3) && ((int)p_Var9[1]._M_color < 4)) {
            puVar5 = (setup->AbsSetup).
                     super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (puVar14 = (setup->AbsSetup).
                           super__Vector_base<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar5;
                puVar14 = puVar14 + 1) {
              iVar7 = ioctl(this->fd_,0x40045567,(ulong)*puVar14->Code);
              if (iVar7 != 0) {
                this_00 = (system_error *)__cxa_allocate_exception(0x20);
                piVar11 = __errno_location();
                iVar7 = *piVar11;
                peVar12 = (error_category *)std::_V2::system_category();
                std::system_error::system_error(this_00,iVar7,peVar12,"UI_SET_ABSBIT ioctl failed");
                goto LAB_00104264;
              }
              iVar7 = ioctl(this->fd_,0x401c5504,puVar14);
              if (iVar7 != 0) {
                this_00 = (system_error *)__cxa_allocate_exception(0x20);
                piVar11 = __errno_location();
                iVar7 = *piVar11;
                peVar12 = (error_category *)std::_V2::system_category();
                std::system_error::system_error(this_00,iVar7,peVar12,"UI_ABS_SETUP ioctl failed");
                goto LAB_00104264;
              }
            }
          }
        }
      }
    }
    for (p_Var8 = (setup->Props)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(setup->Props)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      iVar7 = ioctl(this->fd_,0x4004556e,(ulong)p_Var8[1]._M_color);
      if (iVar7 != 0) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        piVar11 = __errno_location();
        iVar7 = *piVar11;
        peVar12 = (error_category *)std::_V2::system_category();
        std::system_error::system_error(this_00,iVar7,peVar12,"UI_SET_PROPBIT ioctl failed");
        goto LAB_00104264;
      }
    }
    iVar7 = ioctl(this->fd_,0x405c5503,setup);
    if (iVar7 == 0) {
      iVar7 = ioctl(this->fd_,0x5501);
      if (iVar7 == 0) {
        return;
      }
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar11 = __errno_location();
      iVar7 = *piVar11;
      peVar12 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar7,peVar12,"UI_DEV_CREATE ioctl failed");
    }
    else {
      this_00 = (system_error *)__cxa_allocate_exception(0x20);
      piVar11 = __errno_location();
      iVar7 = *piVar11;
      peVar12 = (error_category *)std::_V2::system_category();
      std::system_error::system_error(this_00,iVar7,peVar12,"UI_DEV_SETUP ioctl failed");
    }
  }
LAB_00104264:
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void uInput::__init(const uInputSetup &setup) {
	fd_ = open("/dev/uinput", O_WRONLY | O_NONBLOCK);

	if (fd_ < 0)
		throw std::system_error(errno, std::system_category(), "failed to open uinput device");

	for (auto it : setup.Events) {
		if (ioctl(fd_, UI_SET_EVBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
	}

	if (setup.Events.find(EV_KEY) != setup.Events.end()) {
		for (auto it : setup.Keys) {
			if (ioctl(fd_, UI_SET_KEYBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_EVBIT ioctl failed");
		}
	}

	if (setup.Events.find(EV_REL) != setup.Events.end()) {
		for (auto it : setup.Rels) {
			if (ioctl(fd_, UI_SET_RELBIT, it))
				throw std::system_error(errno, std::system_category(), "UI_SET_RELBIT ioctl failed");
		}
	}


//	uinput_abs_setup s1, s2, s3, s4;
//
//	memset(&s1, 0, sizeof(uinput_abs_setup));
//	memset(&s2, 0, sizeof(uinput_abs_setup));
//	memset(&s3, 0, sizeof(uinput_abs_setup));
//	memset(&s4, 0, sizeof(uinput_abs_setup));
//
//	s1.code = ABS_MT_POSITION_X;
//	s2.code = ABS_MT_POSITION_Y;
//	s3.code = ABS_MT_SLOT;
//	s4.code = ABS_MT_TRACKING_ID;
//
//	s1.absinfo.maximum = s2.absinfo.maximum = 4000;
//	s3.absinfo.maximum = 5;
//	s4.absinfo.maximum = 65535;
//
//	ioctl(FD, UI_ABS_SETUP, &s1);
//	ioctl(FD, UI_ABS_SETUP, &s2);
//	ioctl(FD, UI_ABS_SETUP, &s3);
//	ioctl(FD, UI_ABS_SETUP, &s4);


	if (setup.Events.find(EV_ABS) != setup.Events.end()) {

		for (auto &it : setup.AbsSetup) {
			if (ioctl(fd_, UI_SET_ABSBIT, it.Code))
				throw std::system_error(errno, std::system_category(), "UI_SET_ABSBIT ioctl failed");

			if (ioctl(fd_, UI_ABS_SETUP, &(it.setup)))
				throw std::system_error(errno, std::system_category(), "UI_ABS_SETUP ioctl failed");
		}
	}

	for (auto &it : setup.Props) {
		if (ioctl(fd_, UI_SET_PROPBIT, it))
			throw std::system_error(errno, std::system_category(), "UI_SET_PROPBIT ioctl failed");
	}

	if (ioctl(fd_, UI_DEV_SETUP, &(setup.DeviceInfo.usetup)))
		throw std::system_error(errno, std::system_category(), "UI_DEV_SETUP ioctl failed");

	if (ioctl(fd_, UI_DEV_CREATE))
		throw std::system_error(errno, std::system_category(), "UI_DEV_CREATE ioctl failed");

}